

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

QWidget * __thiscall
QLineEditPrivate::addAction
          (QLineEditPrivate *this,QAction *newAction,QAction *before,ActionPosition position,
          int flags)

{
  QWidget *parent;
  void **ppvVar1;
  SideWidgetEntry *e;
  undefined4 *puVar2;
  QWidgetAction *this_00;
  QLineEditIconButton *this_01;
  SideWidgetLocation SVar3;
  pointer pSVar4;
  const_iterator __position;
  SideWidgetEntryList *this_02;
  long in_FS_OFFSET;
  Connection local_70;
  QObject local_68 [8];
  code *local_60;
  ImplFn local_58;
  value_type local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (newAction == (QAction *)0x0) {
    this_01 = (QLineEditIconButton *)0x0;
    goto LAB_00421652;
  }
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (((this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->leadingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->trailingSideWidgets).
      super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    local_50.widget = (QWidget *)QLineEdit::textChanged;
    local_50.action = (QAction *)0x0;
    local_60 = textChanged;
    local_58 = (ImplFn)0x0;
    puVar2 = (undefined4 *)operator_new(0x20);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QLineEditPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
         ::impl;
    *(code **)(puVar2 + 4) = textChanged;
    *(undefined8 *)(puVar2 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)parent,(QObject *)&local_50,(void **)parent,
               (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    QLineEdit::text((QString *)&local_50,(QLineEdit *)parent);
    this->lastTextSize = local_50.flags;
    if ((QLineEditIconButton *)local_50.widget != (QLineEditIconButton *)0x0) {
      LOCK();
      *(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
               super_QWidget =
           *(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
                    super_QWidget + -1;
      UNLOCK();
      if (*(int *)&(((QToolButton *)&(local_50.widget)->super_QObject)->super_QAbstractButton).
                   super_QWidget == 0) {
        QArrayData::deallocate((QArrayData *)local_50.widget,2,0x10);
      }
    }
  }
  this_00 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
  if ((this_00 == (QWidgetAction *)0x0) ||
     (this_01 = (QLineEditIconButton *)QWidgetAction::requestWidget(this_00,parent),
     this_01 == (QLineEditIconButton *)0x0)) {
    this_01 = (QLineEditIconButton *)operator_new(0x38);
    QToolButton::QToolButton((QToolButton *)this_01,parent);
    *(undefined ***)&(this_01->super_QToolButton).super_QAbstractButton.super_QWidget =
         &PTR_metaObject_007f46c8;
    *(undefined ***)
     &(this_01->super_QToolButton).super_QAbstractButton.super_QWidget.super_QPaintDevice =
         &PTR__QLineEditIconButton_007f4898;
    this_01->m_opacity = 0.0;
    this_01->m_hideWithText = false;
    this_01->m_fadingOut = false;
    QWidget::setFocusPolicy((QWidget *)this_01,NoFocus);
    QAction::icon();
    QAbstractButton::setIcon((QAbstractButton *)this_01,(QIcon *)&local_50);
    QIcon::~QIcon((QIcon *)&local_50);
    QLineEditIconButton::setOpacity(this_01,(double)((flags & 1U) == 0 || 0 < this->lastTextSize));
    if ((flags & 4U) != 0) {
      local_50.widget = (QWidget *)QAbstractButton::clicked;
      local_50.action = (QAction *)0x0;
      local_60 = clearButtonClicked;
      local_58 = (ImplFn)0x0;
      ppvVar1 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
      puVar2 = (undefined4 *)operator_new(0x20);
      *puVar2 = 1;
      *(code **)(puVar2 + 2) =
           QtPrivate::QPrivateSlotObject<void_(QLineEditPrivate::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(code **)(puVar2 + 4) = clearButtonClicked;
      *(undefined8 *)(puVar2 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_70,(void **)this_01,(QObject *)&local_50,ppvVar1,
                 (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_70);
      this_01->m_hideWithText = true;
    }
    QToolButton::setDefaultAction((QToolButton *)this_01,newAction);
  }
  else {
    flags = flags | 2;
  }
  if (before == (QAction *)0x0) {
    if (position == TrailingPosition && (flags & 4U) == 0) {
      for (pSVar4 = (this->trailingSideWidgets).
                    super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar4 != (this->trailingSideWidgets).
                    super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
        if ((pSVar4->flags & 4) != 0) {
          before = pSVar4->action;
          if (before != (QAction *)0x0) goto LAB_004215a5;
          break;
        }
      }
    }
    this_02 = &this->leadingSideWidgets;
    if (position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
LAB_0042162a:
    __position._M_current =
         (this_02->
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
LAB_004215a5:
    SVar3 = findSideWidget(this,before);
    this_02 = &this->leadingSideWidgets;
    if (SVar3.position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
    if ((long)SVar3 < 0) goto LAB_0042162a;
    __position._M_current =
         (this_02->
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         )._M_impl.super__Vector_impl_data._M_start + ((ulong)SVar3 >> 0x20);
  }
  local_50.widget = (QWidget *)this_01;
  local_50.action = newAction;
  local_50.flags = flags;
  std::vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
  ::_M_insert_rval(this_02,__position,&local_50);
  positionSideWidgets(this);
  QWidget::show((QWidget *)this_01);
LAB_00421652:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QWidget *)this_01;
}

Assistant:

QWidget *QLineEditPrivate::addAction(QAction *newAction, QAction *before, QLineEdit::ActionPosition position, int flags)
{
    Q_Q(QLineEdit);
    if (!newAction)
        return nullptr;
    if (!hasSideWidgets()) { // initial setup.
        QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                this, &QLineEditPrivate::textChanged);
        lastTextSize = q->text().size();
    }
    QWidget *w = nullptr;
    // Store flags about QWidgetAction here since removeAction() may be called from ~QAction,
    // in which a qobject_cast<> no longer works.
    if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction *>(newAction)) {
        if ((w = widgetAction->requestWidget(q)))
            flags |= SideWidgetCreatedByWidgetAction;
    }
    if (!w) {
#if QT_CONFIG(toolbutton)
        QLineEditIconButton *toolButton = new QLineEditIconButton(q);
        toolButton->setIcon(newAction->icon());
        toolButton->setOpacity(lastTextSize > 0 || !(flags & SideWidgetFadeInWithText) ? 1 : 0);
        if (flags & SideWidgetClearButton) {
            QObjectPrivate::connect(toolButton, &QToolButton::clicked,
                                    this, &QLineEditPrivate::clearButtonClicked);

#if QT_CONFIG(animation)
            // The clear button is handled only by this widget. The button should be really
            // shown/hidden in order to calculate size hints correctly.
            toolButton->setHideWithText(true);
#endif
        }
        toolButton->setDefaultAction(newAction);
        w = toolButton;
#else
        return nullptr;
#endif
    }

    // QTBUG-59957: clear button should be the leftmost action.
    if (!before && !(flags & SideWidgetClearButton) && position == QLineEdit::TrailingPosition) {
        for (const SideWidgetEntry &e : trailingSideWidgets) {
            if (e.flags & SideWidgetClearButton) {
                before = e.action;
                break;
            }
        }
    }

    // If there is a 'before' action, it takes preference

    // There's a bug in GHS compiler that causes internal error on the following code.
    // The affected GHS compiler versions are 2016.5.4 and 2017.1. GHS internal reference
    // to track the progress of this issue is TOOLS-26637.
    // This temporary workaround allows to compile with GHS toolchain and should be
    // removed when GHS provides a patch to fix the compiler issue.

#if defined(Q_CC_GHS)
    const SideWidgetLocation loc = {position, -1};
    const auto location = before ? findSideWidget(before) : loc;
#else
    const auto location = before ? findSideWidget(before) : SideWidgetLocation{position, -1};
#endif

    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    list.insert(location.isValid() ? list.begin() + location.index : list.end(),
                SideWidgetEntry(w, newAction, flags));
    positionSideWidgets();
    w->show();
    return w;
}